

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O2

void wmap(settings_w *sesskey,char *outkey,Conf *conf,int primary,_Bool include_values)

{
  undefined4 uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  byte *value;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  undefined3 in_register_00000081;
  int iVar8;
  byte *pbVar9;
  char *pcVar10;
  char *key;
  Conf *local_50;
  undefined4 local_44;
  settings_w *local_40;
  char *local_38;
  
  local_44 = CONCAT31(in_register_00000081,include_values);
  iVar8 = 1;
  pcVar10 = (char *)0x0;
  local_50 = conf;
  local_40 = sesskey;
  local_38 = outkey;
  while (pcVar2 = conf_get_str_strs(local_50,primary,pcVar10,&key), pcVar10 = key,
        pcVar2 != (char *)0x0) {
    sVar3 = strlen(key);
    sVar4 = strlen(pcVar2);
    iVar8 = iVar8 + ((int)sVar4 + (int)sVar3) * 2 + 2;
  }
  value = (byte *)safemalloc((long)iVar8,1,0);
  pbVar5 = (byte *)conf_get_str_strs(local_50,primary,(char *)0x0,&key);
  uVar1 = local_44;
  pbVar9 = value;
LAB_0013ba2f:
  pcVar10 = key;
  if (pbVar5 == (byte *)0x0) {
    *pbVar9 = 0;
    write_setting_s(local_40,local_38,(char *)value);
    safefree(value);
    return;
  }
  if (((primary == 0xb0) && (*pbVar5 == 0x44)) && (pbVar5[1] == 0)) {
    key = dupstr(key);
    pcVar2 = strchr(key,0x4c);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = 'D';
    }
    pbVar5 = (byte *)(anon_var_dwarf_3291b + 10);
  }
  else {
    pcVar10 = (char *)0x0;
  }
  pbVar6 = (byte *)key;
  if (pbVar9 != value) {
    *pbVar9 = 0x2c;
    pbVar9 = pbVar9 + 1;
  }
  do {
    bVar7 = *pbVar6;
    if ((bVar7 - 0x2c < 0x31) && ((0x1000000020001U >> ((ulong)(bVar7 - 0x2c) & 0x3f) & 1) != 0)) {
      *pbVar9 = 0x5c;
      pbVar9 = pbVar9 + 1;
      bVar7 = *pbVar6;
    }
    else if (bVar7 == 0) break;
    *pbVar9 = bVar7;
    pbVar9 = pbVar9 + 1;
    pbVar6 = pbVar6 + 1;
  } while( true );
  if ((char)uVar1 != '\0') {
    *pbVar9 = 0x3d;
    do {
      bVar7 = *pbVar5;
      if ((bVar7 - 0x2c < 0x31) && ((0x1000000020001U >> ((ulong)(bVar7 - 0x2c) & 0x3f) & 1) != 0))
      {
        pbVar9[1] = 0x5c;
        pbVar9 = pbVar9 + 2;
        bVar7 = *pbVar5;
      }
      else {
        pbVar9 = pbVar9 + 1;
        if (bVar7 == 0) break;
      }
      *pbVar9 = bVar7;
      pbVar5 = pbVar5 + 1;
    } while( true );
  }
  if (pcVar10 != (char *)0x0) {
    free(key);
    key = pcVar10;
  }
  pbVar5 = (byte *)conf_get_str_strs(local_50,primary,key,&key);
  goto LAB_0013ba2f;
}

Assistant:

static void wmap(settings_w *sesskey, char const *outkey, Conf *conf,
                 int primary, bool include_values)
{
    char *buf, *p, *key, *realkey;
    const char *val, *q;
    int len;

    len = 1;                           /* allow for NUL */

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key))
        len += 2 + 2 * (strlen(key) + strlen(val));   /* allow for escaping */

    buf = snewn(len, char);
    p = buf;

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key)) {

        if (primary == CONF_portfwd && !strcmp(val, "D")) {
            /*
             * Backwards-compatibility hack, as above: translate from
             * the sensible internal representation of dynamic
             * forwardings (key "L<port>", value "D") to the
             * conceptually incoherent legacy storage format (key
             * "D<port>", value empty).
             */
            char *L;

            realkey = key;             /* restore it at end of loop */
            val = "";
            key = dupstr(key);
            L = strchr(key, 'L');
            if (L) *L = 'D';
        } else {
            realkey = NULL;
        }

        if (p != buf)
            *p++ = ',';
        for (q = key; *q; q++) {
            if (*q == '=' || *q == ',' || *q == '\\')
                *p++ = '\\';
            *p++ = *q;
        }
        if (include_values) {
            *p++ = '=';
            for (q = val; *q; q++) {
                if (*q == '=' || *q == ',' || *q == '\\')
                    *p++ = '\\';
                *p++ = *q;
            }
        }

        if (realkey) {
            free(key);
            key = realkey;
        }
    }
    *p = '\0';
    write_setting_s(sesskey, outkey, buf);
    sfree(buf);
}